

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.cc
# Opt level: O0

bool leveldb::test::RegisterTest(char *base,char *name,_func_void *func)

{
  vector<leveldb::test::(anonymous_namespace)::Test,_std::allocator<leveldb::test::(anonymous_namespace)::Test>_>
  *this;
  undefined1 local_38 [8];
  Test t;
  _func_void *func_local;
  char *name_local;
  char *base_local;
  
  t.func = func;
  if ((anonymous_namespace)::tests ==
      (vector<leveldb::test::(anonymous_namespace)::Test,_std::allocator<leveldb::test::(anonymous_namespace)::Test>_>
       *)0x0) {
    this = (vector<leveldb::test::(anonymous_namespace)::Test,_std::allocator<leveldb::test::(anonymous_namespace)::Test>_>
            *)operator_new(0x18);
    std::
    vector<leveldb::test::(anonymous_namespace)::Test,_std::allocator<leveldb::test::(anonymous_namespace)::Test>_>
    ::vector(this);
    (anonymous_namespace)::tests = this;
  }
  t.name = (char *)t.func;
  local_38 = (undefined1  [8])base;
  t.base = name;
  std::
  vector<leveldb::test::(anonymous_namespace)::Test,_std::allocator<leveldb::test::(anonymous_namespace)::Test>_>
  ::push_back((anonymous_namespace)::tests,(value_type *)local_38);
  return true;
}

Assistant:

bool RegisterTest(const char* base, const char* name, void (*func)()) {
  if (tests == nullptr) {
    tests = new std::vector<Test>;
  }
  Test t;
  t.base = base;
  t.name = name;
  t.func = func;
  tests->push_back(t);
  return true;
}